

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

CTransactionRef __thiscall
node::GetTransaction
          (node *this,CBlockIndex *block_index,CTxMemPool *mempool,uint256 *hash,uint256 *hashBlock,
          BlockManager *blockman)

{
  unique_ptr<TxIndex,_std::default_delete<TxIndex>_> this_00;
  bool bVar1;
  CTxMemPool *extraout_RDX;
  CTxMemPool *extraout_RDX_00;
  CTxMemPool *extraout_RDX_01;
  CTxMemPool *extraout_RDX_02;
  CTxMemPool *extraout_RDX_03;
  CTxMemPool *extraout_RDX_04;
  CTransactionRef *ptx;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long in_FS_OFFSET;
  CTransactionRef CVar3;
  uint256 block_hash;
  CBlock local_c8;
  base_blob<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (block_index == (CBlockIndex *)0x0 && mempool != (CTxMemPool *)0x0) {
    CVar3 = CTxMemPool::get((CTxMemPool *)this,(uint256 *)mempool);
    mempool = (CTxMemPool *)
              CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (*(long *)this != 0) goto LAB_00249203;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8));
    mempool = extraout_RDX;
  }
  this_00._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
  super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
  super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl =
       g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
       super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
       super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
      g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
      super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
      super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_c8.super_CBlockHeader.nVersion = 0;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    bVar1 = TxIndex::FindTx((TxIndex *)
                            this_00._M_t.
                            super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                            super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                            super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl,hash,
                            (uint256 *)&local_c8,(CTransactionRef *)this);
    if (bVar1) {
      mempool = extraout_RDX_00;
      if (block_index != (CBlockIndex *)0x0) {
        CBlockIndex::GetBlockHash((uint256 *)&local_58,block_index);
        bVar1 = ::operator==(&local_58,(base_blob<256U> *)&local_c8);
        mempool = extraout_RDX_01;
        if (!bVar1) goto LAB_0024919d;
      }
      *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x10) =
           local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_;
      *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x18) =
           local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_;
      *(undefined8 *)(hashBlock->super_base_blob<256U>).m_data._M_elems =
           local_c8.super_CBlockHeader._0_8_;
      *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 8) =
           local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_;
      goto LAB_00249203;
    }
LAB_0024919d:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8));
    mempool = extraout_RDX_02;
  }
  if (block_index != (CBlockIndex *)0x0) {
    CBlock::CBlock(&local_c8);
    bVar1 = BlockManager::ReadBlockFromDisk(blockman,&local_c8,block_index);
    p_Var2 = &(local_c8.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
    if (bVar1) {
      for (; p_Var2 != &(local_c8.vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
          p_Var2 = p_Var2 + 1) {
        bVar1 = transaction_identifier<false>::operator==(&p_Var2->_M_ptr->hash,hash);
        if (bVar1) {
          CBlockIndex::GetBlockHash((uint256 *)&local_58,block_index);
          *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x10) =
               local_58.m_data._M_elems._16_8_;
          *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x18) =
               local_58.m_data._M_elems._24_8_;
          *(undefined8 *)(hashBlock->super_base_blob<256U>).m_data._M_elems =
               local_58.m_data._M_elems._0_8_;
          *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 8) =
               local_58.m_data._M_elems._8_8_;
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&local_c8.vtx);
          mempool = extraout_RDX_04;
          goto LAB_00249203;
        }
      }
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_c8.vtx);
    mempool = extraout_RDX_03;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_00249203:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mempool;
  CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CTransactionRef)CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CTransactionRef GetTransaction(const CBlockIndex* const block_index, const CTxMemPool* const mempool, const uint256& hash, uint256& hashBlock, const BlockManager& blockman)
{
    if (mempool && !block_index) {
        CTransactionRef ptx = mempool->get(hash);
        if (ptx) return ptx;
    }
    if (g_txindex) {
        CTransactionRef tx;
        uint256 block_hash;
        if (g_txindex->FindTx(hash, block_hash, tx)) {
            if (!block_index || block_index->GetBlockHash() == block_hash) {
                // Don't return the transaction if the provided block hash doesn't match.
                // The case where a transaction appears in multiple blocks (e.g. reorgs or
                // BIP30) is handled by the block lookup below.
                hashBlock = block_hash;
                return tx;
            }
        }
    }
    if (block_index) {
        CBlock block;
        if (blockman.ReadBlockFromDisk(block, *block_index)) {
            for (const auto& tx : block.vtx) {
                if (tx->GetHash() == hash) {
                    hashBlock = block_index->GetBlockHash();
                    return tx;
                }
            }
        }
    }
    return nullptr;
}